

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filemgr.cc
# Opt level: O0

ssize_t filemgr_read_block(filemgr *file,void *buf,bid_t bid)

{
  fdb_status fVar1;
  encryptor *in_RDX;
  undefined8 in_RSI;
  long in_RDI;
  fdb_status status;
  ssize_t result;
  bid_t in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  void *local_8;
  
  local_8 = (void *)(**(code **)(*(long *)(in_RDI + 0xe8) + 0x10))
                              (*(undefined4 *)(in_RDI + 0x14),in_RSI,*(undefined4 *)(in_RDI + 0x10),
                               (ulong)*(uint *)(in_RDI + 0x10) * (long)in_RDX);
  if ((*(long *)(in_RDI + 0x230) != 0) && (0 < (long)local_8)) {
    if (local_8 == (void *)(ulong)*(uint *)(in_RDI + 0x10)) {
      fVar1 = fdb_decrypt_block(in_RDX,local_8,
                                CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                                in_stack_ffffffffffffffc8);
      if (fVar1 != FDB_RESULT_SUCCESS) {
        local_8 = (void *)(long)fVar1;
      }
    }
    else {
      local_8 = (void *)0xfffffffffffffffb;
    }
  }
  return (ssize_t)local_8;
}

Assistant:

static ssize_t filemgr_read_block(struct filemgr *file, void *buf, bid_t bid) {
    ssize_t result = file->ops->pread(file->fd, buf, file->blocksize,
                                      file->blocksize*bid);
    if (file->encryption.ops && result > 0) {
        if (result != (ssize_t)file->blocksize)
            return FDB_RESULT_READ_FAIL;
        fdb_status status = fdb_decrypt_block(&file->encryption, buf, result, bid);
        if (status != FDB_RESULT_SUCCESS)
            return status;
    }
    return result;
}